

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::erase
          (ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this,Iterator start_it,
          Iterator end_it)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = end_it.index;
  uVar3 = start_it.index;
  if ((&(start_it.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> != this) ||
     (&(start_it.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> !=
      &(end_it.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>)) {
    __assert_fail("start_it.parent == end_it.parent && start_it.parent == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                  ,0xe8,
                  "void ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::erase(Iterator, Iterator) [SubType = cashew::ArrayStorage, T = cashew::Ref]"
                 );
  }
  lVar2 = uVar4 - uVar3;
  if ((uVar3 <= uVar4) && (uVar1 = this->usedElements, uVar4 <= uVar1)) {
    for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      this->data[uVar3].inst = this->data[uVar4].inst;
      uVar3 = uVar3 + 1;
    }
    this->usedElements = uVar1 - lVar2;
    return;
  }
  __assert_fail("start_it.index <= end_it.index && end_it.index <= usedElements",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0xe9,
                "void ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::erase(Iterator, Iterator) [SubType = cashew::ArrayStorage, T = cashew::Ref]"
               );
}

Assistant:

void erase(Iterator start_it, Iterator end_it) {
    assert(start_it.parent == end_it.parent && start_it.parent == this);
    assert(start_it.index <= end_it.index && end_it.index <= usedElements);
    size_t size = end_it.index - start_it.index;
    for (size_t cur = start_it.index; cur + size < usedElements; ++cur) {
      data[cur] = data[cur + size];
    }
    usedElements -= size;
  }